

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_lzma_codec.cpp
# Opt level: O1

bool __thiscall crnlib::lzma_codec::pack(lzma_codec *this,void *p,uint n,vector<unsigned_char> *buf)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  bool bVar9;
  size_t destLen;
  ulong local_58;
  uchar *local_50;
  size_t outPropsSize;
  ulong local_40;
  lzma_codec *local_38;
  
  if (n < 0x40000001) {
    uVar6 = 0x80;
    if (0x80 < n >> 8) {
      uVar6 = n >> 8;
    }
    uVar4 = uVar6 + n + 0x14;
    uVar8 = buf->m_size;
    local_50 = (uchar *)p;
    local_38 = this;
    if (uVar8 != uVar4) {
      if (uVar8 <= uVar4) {
        if (buf->m_capacity < uVar4) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)buf,uVar4,uVar8 == uVar6 + n + 0x13,1,(object_mover)0x0,
                     false);
        }
        memset(buf->m_p + buf->m_size,0,(ulong)(uVar4 - buf->m_size));
      }
      buf->m_size = uVar4;
    }
    puVar5 = buf->m_p;
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    puVar5[4] = '\0';
    puVar5[5] = '\0';
    puVar5[6] = '\0';
    puVar5[7] = '\0';
    puVar5[8] = '\0';
    puVar5[9] = '\0';
    puVar5[10] = '\0';
    puVar5[0xb] = '\0';
    puVar5[0xc] = '\0';
    puVar5[0xd] = '\0';
    puVar5[0xe] = '\0';
    puVar5[0xf] = '\0';
    puVar5[0x10] = '\0';
    puVar5[0x11] = '\0';
    puVar5[0x12] = '\0';
    puVar5[0x13] = '\0';
    lVar2 = 0xc;
    uVar3 = n;
    do {
      puVar5[lVar2] = (uchar)(uVar3 >> 0x18);
      uVar3 = uVar3 << 8;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x10);
    local_40 = (ulong)n;
    uVar3 = adler32(local_50,local_40,1);
    lVar2 = 0x10;
    do {
      puVar5[lVar2] = (uchar)(uVar3 >> 0x18);
      uVar3 = uVar3 << 8;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x14);
    if (n != 0) {
      local_58 = (ulong)(n + 1 >> 1);
      iVar7 = 3;
      uVar6 = uVar6 + n + 0x14;
      do {
        destLen = (size_t)(uVar6 - 0x14);
        outPropsSize = 5;
        iVar1 = (*local_38->m_pCompress)
                          (puVar5 + 0x14,&destLen,local_50,local_40,puVar5 + 3,&outPropsSize,-1,0,-1
                           ,-1,-1,-1,2 - (uint)(g_number_of_processors < 2));
        if (iVar1 != 7) {
          bVar9 = iVar1 == 0;
          goto LAB_0012f020;
        }
        uVar4 = (int)local_58 + uVar6;
        uVar8 = buf->m_size;
        if (uVar4 != uVar8) {
          if (uVar8 <= uVar4) {
            if (buf->m_capacity < uVar4) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)buf,uVar4,((int)local_58 + uVar6) - 1 == uVar8,1,
                         (object_mover)0x0,false);
            }
            memset(buf->m_p + buf->m_size,0,(ulong)(uVar4 - buf->m_size));
          }
          buf->m_size = uVar4;
        }
        puVar5 = buf->m_p;
        iVar7 = iVar7 + -1;
        uVar6 = uVar4;
      } while (iVar7 != 0);
      bVar9 = false;
LAB_0012f020:
      if (bVar9) {
        lVar2 = 0;
        iVar7 = (int)destLen;
        do {
          puVar5[lVar2 + 8] = (uchar)((uint)iVar7 >> 0x18);
          iVar7 = iVar7 << 8;
          lVar2 = lVar2 + 1;
        } while (lVar2 != 4);
        uVar8 = (int)destLen + 0x14;
        uVar6 = buf->m_size;
        if (uVar6 != uVar8) {
          if (uVar6 <= uVar8) {
            if (buf->m_capacity < uVar8) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)buf,uVar8,uVar6 == (int)destLen + 0x13U,1,
                         (object_mover)0x0,false);
            }
            memset(buf->m_p + buf->m_size,0,(ulong)(uVar8 - buf->m_size));
          }
          buf->m_size = uVar8;
        }
      }
      else if (buf->m_p != (uchar *)0x0) {
        crnlib_free(buf->m_p);
        buf->m_p = (uchar *)0x0;
        buf->m_size = 0;
        buf->m_capacity = 0;
      }
      if (!bVar9) goto LAB_0012f0de;
    }
    iVar7 = 0x304c0000;
    lVar2 = 0;
    do {
      puVar5[lVar2] = (uchar)((uint)iVar7 >> 0x18);
      iVar7 = iVar7 << 8;
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    uVar3 = adler32(puVar5 + 3,0x11,1);
    puVar5[2] = (uchar)uVar3;
    bVar9 = true;
  }
  else {
LAB_0012f0de:
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool lzma_codec::pack(const void* p, uint n, crnlib::vector<uint8>& buf) {
  if (n > 1024U * 1024U * 1024U)
    return false;

  uint max_comp_size = n + math::maximum<uint>(128, n >> 8);
  buf.resize(sizeof(header) + max_comp_size);

  header* pHDR = reinterpret_cast<header*>(&buf[0]);
  uint8* pComp_data = &buf[sizeof(header)];

  utils::zero_object(*pHDR);

  pHDR->m_uncomp_size = n;
  pHDR->m_adler32 = adler32(p, n);

  if (n) {
    size_t destLen = 0;
    size_t outPropsSize = 0;
    int status = SZ_ERROR_INPUT_EOF;

    for (uint trial = 0; trial < 3; trial++) {
      destLen = max_comp_size;
      outPropsSize = cLZMAPropsSize;

      status = (*m_pCompress)(pComp_data, &destLen, reinterpret_cast<const unsigned char*>(p), n,
                              pHDR->m_lzma_props, &outPropsSize,
                              -1, /* 0 <= level <= 9, default = 5 */
                              0,  /* default = (1 << 24) */
                              -1, /* 0 <= lc <= 8, default = 3  */
                              -1, /* 0 <= lp <= 4, default = 0  */
                              -1, /* 0 <= pb <= 4, default = 2  */
                              -1, /* 5 <= fb <= 273, default = 32 */
                              (g_number_of_processors > 1) ? 2 : 1
                              );

      if (status != SZ_ERROR_OUTPUT_EOF)
        break;

      max_comp_size += ((n + 1) / 2);
      buf.resize(sizeof(header) + max_comp_size);
      pHDR = reinterpret_cast<header*>(&buf[0]);
      pComp_data = &buf[sizeof(header)];
    }

    if (status != SZ_OK) {
      buf.clear();
      return false;
    }

    pHDR->m_comp_size = static_cast<uint>(destLen);

    buf.resize(CRNLIB_SIZEOF_U32(header) + static_cast<uint32>(destLen));
  }

  pHDR->m_sig = header::cSig;
  pHDR->m_checksum = static_cast<uint8>(adler32((uint8*)pHDR + header::cChecksumSkipBytes, sizeof(header) - header::cChecksumSkipBytes));

  return true;
}